

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

bool __thiscall
QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::endSeparatorMove
          (QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *this,QPoint *param_1)

{
  long lVar1;
  
  lVar1 = (this->movingSeparator).d.size;
  if (lVar1 != 0) {
    QList<int>::clear(&this->movingSeparator);
    QToolBarAreaLayout::clear((QToolBarAreaLayout *)&this[9].hoverSeparator.d.size);
    QDockAreaLayout::clear((QDockAreaLayout *)&this[0xb].movingSeparator.d.ptr);
    *(undefined8 *)&this[8].separatorMoveTimer = 0;
    this[9].hoverSeparator.d.d = (Data *)0xffffffffffffffff;
  }
  return lVar1 != 0;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }